

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.h
# Opt level: O0

void __thiscall
Js::DeserializationCloner<Js::StreamReader>::ReadObjectPropertiesIntoBag
          (DeserializationCloner<Js::StreamReader> *this,SCAPropBag *m_propbag)

{
  scaposition_t src;
  HRESULT hr_00;
  Engine *this_00;
  Var pvStack_30;
  HRESULT hr;
  Var value;
  char16 *name;
  SCAPropBag *pSStack_18;
  charcount_t len;
  SCAPropBag *m_propbag_local;
  DeserializationCloner<Js::StreamReader> *this_local;
  
  name._4_4_ = 0;
  pSStack_18 = m_propbag;
  m_propbag_local = (SCAPropBag *)this;
  value = TryReadString(this,(charcount_t *)((long)&name + 4),false);
  if ((char16 *)value == (char16 *)0x0) {
    return;
  }
  this_00 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
            ::GetEngine(&this->
                         super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                       );
  src = StreamReader::GetPosition(this->m_reader);
  SCAEngine<unsigned_int,_void_*,_Js::DeserializationCloner<Js::StreamReader>_>::Clone
            (this_00,src,&stack0xffffffffffffffd0);
  if (pvStack_30 == (Var)0x0) {
    ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
  }
  hr_00 = SCAPropBag::InternalAddNoCopy(pSStack_18,(LPCWSTR)value,name._4_4_,pvStack_30);
  ScriptContextHolder::ThrowIfFailed(&pSStack_18->super_ScriptContextHolder,hr_00);
}

Assistant:

void ReadObjectPropertiesIntoBag(SCAPropBag* m_propbag)
        {
            for (;;)
            {
                charcount_t len = 0;
                // NOTE: we will not reuse buffer here since the propbag may retain the string.
                const char16* name = TryReadString(&len, /*reuseBuffer*/ false);
                if (!name)
                {
                    break;
                }

                Var value;
                this->GetEngine()->Clone(m_reader->GetPosition(), &value);
                if (!value)
                {
                    this->ThrowSCADataCorrupt();
                }

                HRESULT hr = m_propbag->InternalAddNoCopy(name, len, value);
                m_propbag->ThrowIfFailed(hr);
            }
        }